

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::deletePointers<std::vector<OpenMD::Shape*,std::allocator<OpenMD::Shape*>>>
               (vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *container)

{
  bool bVar1;
  iterator val;
  Shape **elem;
  iterator __end0;
  iterator __begin0;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *__range3;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Shape **)
       std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  val = std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::end
                  (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                        *)val._M_current,
                       (__normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 =
         (vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)
         __gnu_cxx::
         __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
         ::operator*(local_18);
    details::lifted_deleter<OpenMD::Shape*>((Shape *)val._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }